

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp_x86_avx2::forward_inplace(BinaryOp_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  long in_RSI;
  Mat *in_RDI;
  int elempack;
  Option *in_stack_00000070;
  float in_stack_0000007c;
  Mat *in_stack_00000080;
  Option *in_stack_000000a0;
  float in_stack_000000ac;
  Mat *in_stack_000000b0;
  Option *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar1 = *(int *)(in_RSI + 0x18);
  if (iVar1 == 8) {
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 0) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_add_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 1) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_sub_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 2) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_mul_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 3) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_div_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 4) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_max_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 5) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_min_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 6) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_pow_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 7) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_rsub_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 8) {
      iVar1 = binary_op_scalar_inplace_pack8<ncnn::binary_op_rdiv_pack8>
                        (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
      return iVar1;
    }
  }
  if (iVar1 == 4) {
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 0) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_add_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 1) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_sub_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 2) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_mul_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 3) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_div_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 4) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_max_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 5) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_min_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 6) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_pow_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 7) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_rsub_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) == 8) {
      iVar1 = binary_op_scalar_inplace_pack4<ncnn::binary_op_rdiv_pack4>
                        (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      return iVar1;
    }
  }
  iVar1 = BinaryOp::forward_inplace
                    ((BinaryOp *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_RDI,
                     in_stack_ffffffffffffffc8);
  return iVar1;
}

Assistant:

int BinaryOp_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}